

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<FileInfoCacheKey,QFileInfo>::emplace<QFileInfo_const&>
          (QHash<FileInfoCacheKey,QFileInfo> *this,FileInfoCacheKey *key,QFileInfo *args)

{
  long in_FS_OFFSET;
  piter pVar1;
  FileInfoCacheKey copy;
  FileInfoCacheKey local_58;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.hash = key->hash;
  local_58.file.d.d = (key->file).d.d;
  local_58.file.d.ptr = (key->file).d.ptr;
  local_58.file.d.size = (key->file).d.size;
  if (&(local_58.file.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_58.file.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_58.file.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_58.pwd.d.d = (key->pwd).d.d;
  local_58.pwd.d.ptr = (key->pwd).d.ptr;
  local_58.pwd.d.size = (key->pwd).d.size;
  if (&(local_58.pwd.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_58.pwd.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_58.pwd.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pVar1 = (piter)emplace<QFileInfo_const&>(this,&local_58,args);
  if (&(local_58.pwd.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.pwd.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.pwd.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.pwd.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.pwd.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.file.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.file.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.file.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.file.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.file.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(const Key &key, Args &&... args)
    {
        Key copy = key; // Needs to be explicit for MSVC 2019
        return emplace(std::move(copy), std::forward<Args>(args)...);
    }